

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O1

QString * offsetFromAbbreviation(QString *__return_storage_ptr__,QString *text)

{
  char16_t *pcVar1;
  long lVar2;
  bool bVar3;
  long in_FS_OFFSET;
  QLatin1StringView needle;
  QLatin1StringView needle_00;
  QStringView haystack;
  QStringView haystack_00;
  QStringBuilder<QStringView_&,_QLatin1String> local_50;
  QStringView local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = (text->d).ptr;
  lVar2 = (text->d).size;
  needle.m_data = "UTC";
  needle.m_size = 3;
  haystack.m_data = pcVar1;
  haystack.m_size = lVar2;
  local_38.m_size = lVar2;
  local_38.m_data = pcVar1;
  bVar3 = QtPrivate::startsWith(haystack,needle,CaseSensitive);
  if ((bVar3) ||
     (needle_00.m_data = "GMT", needle_00.m_size = 3, haystack_00.m_data = pcVar1,
     haystack_00.m_size = lVar2, bVar3 = QtPrivate::startsWith(haystack_00,needle_00,CaseSensitive),
     bVar3)) {
    local_38.m_data = pcVar1 + 3;
    local_38.m_size = lVar2 + -3;
  }
  if (local_38.m_size == 0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = L"+00:00";
    (__return_storage_ptr__->d).size = 6;
  }
  else {
    if (3 < local_38.m_size) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        QString::right(__return_storage_ptr__,text,local_38.m_size);
        return __return_storage_ptr__;
      }
      goto LAB_00316317;
    }
    local_50.a = &local_38;
    local_50.b.m_size = 3;
    local_50.b.m_data = ":00";
    QStringBuilder<QStringView_&,_QLatin1String>::convertTo<QString>
              (__return_storage_ptr__,&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
LAB_00316317:
  __stack_chk_fail();
}

Assistant:

static QString offsetFromAbbreviation(QString &&text)
{
    QStringView tail{text};
    // May need to strip a prefix:
    if (tail.startsWith("UTC"_L1) || tail.startsWith("GMT"_L1))
        tail = tail.sliced(3);
    // TODO: there may be a locale-specific alternative prefix.
    // Hard to know without zone-name L10n details, though.
    return (tail.isEmpty() // The Qt::UTC case omits the zero offset:
            ? u"+00:00"_s
            // Whole-hour offsets may lack the zero minutes:
            : (tail.size() <= 3
               ? tail + ":00"_L1
               : std::move(text).right(tail.size())));
}